

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O2

int __thiscall piksel::Image::loadBase64(Image *this,string *encoded)

{
  int iVar1;
  stbi_uc *data;
  string decoded;
  
  stbi_set_flip_vertically_on_load(1);
  base64_decode(&decoded,encoded);
  data = stbi_load_from_memory
                   ((stbi_uc *)decoded._M_dataplus._M_p,(int)decoded._M_string_length,&this->width,
                    &this->height,(int *)0x0,4);
  iVar1 = _load(this,data);
  std::__cxx11::string::~string((string *)&decoded);
  return iVar1;
}

Assistant:

int Image::loadBase64(std::string encoded) {
	stbi_set_flip_vertically_on_load(1);
	std::string decoded = base64_decode(encoded);
	unsigned char* data = stbi_load_from_memory(reinterpret_cast<const unsigned char *>(decoded.c_str()), decoded.length(), &width, &height, NULL, 4);
	return _load(data);
}